

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint64_t expectedUnits;
  string *psVar1;
  bool bVar2;
  WeightParamType WVar3;
  BatchnormLayerParams *pBVar4;
  Result *_result;
  WeightParams *pWVar5;
  bool bVar6;
  allocator<char> local_9a;
  allocator<char> local_99;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Batchnorm",(allocator<char> *)&err);
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"Batchnorm",(allocator<char> *)&local_70);
    validateRankCount(__return_storage_ptr__,layer,&err,3,-1,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&err);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
  pWVar5 = pBVar4->gamma_;
  if (pWVar5 == (WeightParams *)0x0) {
    pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  WVar3 = valueType(pWVar5);
  if (WVar3 == FLOAT32) {
LAB_00278952:
    bVar2 = false;
  }
  else {
    pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
    pWVar5 = pBVar4->beta_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType(pWVar5);
    if (WVar3 == FLOAT32) goto LAB_00278952;
    pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
    pWVar5 = pBVar4->mean_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType(pWVar5);
    if (WVar3 == FLOAT32) goto LAB_00278952;
    pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
    pWVar5 = pBVar4->variance_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType(pWVar5);
    bVar2 = WVar3 != FLOAT32;
  }
  pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
  pWVar5 = pBVar4->gamma_;
  if (pWVar5 == (WeightParams *)0x0) {
    pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  WVar3 = valueType(pWVar5);
  if (WVar3 == FLOAT16) {
LAB_002789be:
    bVar6 = false;
  }
  else {
    pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
    pWVar5 = pBVar4->beta_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType(pWVar5);
    if (WVar3 == FLOAT16) goto LAB_002789be;
    pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
    pWVar5 = pBVar4->mean_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType(pWVar5);
    if (WVar3 == FLOAT16) goto LAB_002789be;
    pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
    pWVar5 = pBVar4->variance_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType(pWVar5);
    bVar6 = WVar3 != FLOAT16;
  }
  pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
  pWVar5 = pBVar4->gamma_;
  if (pWVar5 == (WeightParams *)0x0) {
    pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  WVar3 = valueType(pWVar5);
  if (WVar3 != UNSPECIFIED) {
    pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
    pWVar5 = pBVar4->beta_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType(pWVar5);
    if (WVar3 != UNSPECIFIED) {
      pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
      pWVar5 = pBVar4->mean_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      WVar3 = valueType(pWVar5);
      if (WVar3 != UNSPECIFIED) {
        pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
        pWVar5 = pBVar4->variance_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType(pWVar5);
        if ((WVar3 != UNSPECIFIED) && (bVar2 || bVar6)) {
          pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
          expectedUnits = pBVar4->channels_;
          pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
          pWVar5 = pBVar4->gamma_;
          if (pWVar5 == (WeightParams *)0x0) {
            pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&err,"BatchNorm",&local_99);
          psVar1 = (layer->name_).ptr_;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"gamma",&local_9a);
          validateGeneralWeightParams
                    (__return_storage_ptr__,pWVar5,expectedUnits,1,&err,psVar1,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&err);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)this_00);
          pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
          pWVar5 = pBVar4->beta_;
          if (pWVar5 == (WeightParams *)0x0) {
            pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&err,"BatchNorm",&local_99);
          psVar1 = (layer->name_).ptr_;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"beta",&local_9a);
          validateGeneralWeightParams
                    (__return_storage_ptr__,pWVar5,expectedUnits,1,&err,psVar1,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&err);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)this_00);
          pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
          if (pBVar4->computemeanvar_ != false) {
LAB_00278c30:
            Result::Result(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
          pWVar5 = pBVar4->mean_;
          if (pWVar5 == (WeightParams *)0x0) {
            pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          WVar3 = valueType(pWVar5);
          if (WVar3 != EMPTY) {
            pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
            pWVar5 = pBVar4->mean_;
            if (pWVar5 == (WeightParams *)0x0) {
              pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            WVar3 = valueType(pWVar5);
            if (WVar3 != EMPTY) {
              pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
              pWVar5 = pBVar4->mean_;
              if (pWVar5 == (WeightParams *)0x0) {
                pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"BatchNorm",&local_99);
              psVar1 = (layer->name_).ptr_;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"mean",&local_9a);
              validateGeneralWeightParams
                        (__return_storage_ptr__,pWVar5,expectedUnits,1,&err,psVar1,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&err);
              bVar2 = Result::good(__return_storage_ptr__);
              if (!bVar2) {
                return __return_storage_ptr__;
              }
              std::__cxx11::string::~string((string *)this_00);
              pBVar4 = Specification::NeuralNetworkLayer::batchnorm(layer);
              pWVar5 = pBVar4->variance_;
              if (pWVar5 == (WeightParams *)0x0) {
                pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"BatchNorm",&local_99);
              psVar1 = (layer->name_).ptr_;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"variance",&local_9a);
              validateGeneralWeightParams
                        (__return_storage_ptr__,pWVar5,expectedUnits,1,&err,psVar1,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&err);
              bVar2 = Result::good(__return_storage_ptr__);
              if (!bVar2) {
                return __return_storage_ptr__;
              }
              std::__cxx11::string::~string((string *)this_00);
              goto LAB_00278c30;
            }
          }
          std::operator+(&local_70,"Batchnorm layer \'",(layer->name_).ptr_);
          std::operator+(&err,&local_70,"\' is missing mean and variance.");
          std::__cxx11::string::~string((string *)&local_70);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
          goto LAB_00278a71;
        }
      }
    }
  }
  std::operator+(&local_70,"Batchnorm layer \'",(layer->name_).ptr_);
  std::operator+(&err,&local_70,
                 "\' parameters have values for both full and half precision. Parameters should either be specified in half or full precision, mixed parameters are not supported."
                );
  std::__cxx11::string::~string((string *)&local_70);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_00278a71:
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank));
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta"));

    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance"));
    }
    return Result();
}